

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a9d::DataTransform<sptk::int24_t,_sptk::int24_t>::Run
          (DataTransform<sptk::int24_t,_sptk::int24_t> *this,istream *input_stream)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  istream *in_RSI;
  long in_RDI;
  bool bVar6;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 in_ST7;
  unkbyte10 Var7;
  ostringstream error_message;
  bool is_clipped;
  int24_t output_data;
  invalid_argument *anon_var_0;
  string word;
  int24_t input_data;
  int index;
  char buffer [128];
  size_t *in_stack_fffffffffffffc98;
  undefined2 in_stack_fffffffffffffca0;
  undefined6 in_stack_fffffffffffffca2;
  undefined2 in_stack_fffffffffffffca8;
  undefined6 in_stack_fffffffffffffcaa;
  undefined4 in_stack_fffffffffffffcb0;
  byte in_stack_fffffffffffffcb4;
  undefined1 in_stack_fffffffffffffcb5;
  byte in_stack_fffffffffffffcb6;
  undefined1 in_stack_fffffffffffffcb7;
  allocator *in_stack_fffffffffffffcb8;
  ostream *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  int24_t local_290;
  int24_t local_28c;
  allocator local_289;
  string local_288 [32];
  ostringstream local_268 [240];
  ostringstream *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  int24_t local_eb;
  int24_t local_e8;
  byte local_e5;
  int24_t local_e4 [5];
  int24_t local_d3;
  uint local_d0;
  string local_c0 [33];
  int24_t local_9f;
  int local_9c;
  char local_98 [128];
  istream *local_18;
  byte local_1;
  
  local_9c = 0;
  local_18 = in_RSI;
  do {
    sptk::int24_t::int24_t((int24_t *)0x1371df);
    if ((*(byte *)(in_RDI + 0x35) & 1) == 0) {
      bVar6 = sptk::ReadStream<sptk::int24_t>
                        ((int24_t *)CONCAT62(in_stack_fffffffffffffcaa,in_stack_fffffffffffffca8),
                         (istream *)CONCAT62(in_stack_fffffffffffffca2,in_stack_fffffffffffffca0));
      if (bVar6) goto LAB_0013739a;
      local_d0 = 2;
    }
    else {
      std::__cxx11::string::string(local_c0);
      std::operator>>(local_18,local_c0);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::stold((string *)CONCAT62(in_stack_fffffffffffffca2,in_stack_fffffffffffffca0),
                            in_stack_fffffffffffffc98);
        in_stack_fffffffffffffc98 = (size_t *)in_ST0;
        in_stack_fffffffffffffca0 = (undefined2)((unkuint10)in_ST0 >> 0x40);
        Var7 = in_ST7;
        sptk::int24_t::int24_t<long_double>
                  ((int24_t *)
                   CONCAT17(in_stack_fffffffffffffcb7,
                            CONCAT16(in_stack_fffffffffffffcb6,
                                     CONCAT15(in_stack_fffffffffffffcb5,
                                              CONCAT14(in_stack_fffffffffffffcb4,
                                                       in_stack_fffffffffffffcb0)))),
                   (longdouble)
                   CONCAT28(in_stack_fffffffffffffca8,
                            CONCAT62(in_stack_fffffffffffffca2,in_stack_fffffffffffffca0)));
        sptk::int24_t::operator=(&local_9f,&local_d3);
        sptk::int24_t::~int24_t(&local_d3);
        local_d0 = 0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        in_ST7 = Var7;
      }
      else {
        local_d0 = 2;
      }
      std::__cxx11::string::~string(local_c0);
      if (local_d0 == 0) {
LAB_0013739a:
        local_e4[0].value[2] = local_9f.value[2];
        local_e4[0].value[0] = local_9f.value[0];
        local_e4[0].value[1] = local_9f.value[1];
        local_e5 = 0;
        iVar1 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x37));
        iVar2 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x3a));
        if (iVar1 < iVar2) {
          if (*(int *)(in_RDI + 0x2c) == 1) {
            iVar1 = sptk::int24_t::operator_cast_to_int(&local_9f);
            iVar2 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x37));
            if (iVar1 < iVar2) {
              sptk::int24_t::operator=(local_e4,(int24_t *)(in_RDI + 0x37));
              local_e5 = 1;
            }
            else {
              iVar1 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x3a));
              iVar2 = sptk::int24_t::operator_cast_to_int(&local_9f);
              if (iVar1 < iVar2) {
                sptk::int24_t::operator=(local_e4,(int24_t *)(in_RDI + 0x3a));
                local_e5 = 1;
              }
            }
          }
          else if (*(int *)(in_RDI + 0x2c) == 2) {
            uVar3 = sptk::int24_t::operator_cast_to_int(&local_9f);
            uVar4 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x37));
            if (uVar3 < uVar4) {
              sptk::int24_t::operator=(local_e4,(int24_t *)(in_RDI + 0x37));
              local_e5 = 1;
            }
            else {
              uVar3 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x3a));
              uVar4 = sptk::int24_t::operator_cast_to_int(&local_9f);
              if (uVar3 < uVar4) {
                sptk::int24_t::operator=(local_e4,(int24_t *)(in_RDI + 0x3a));
                local_e5 = 1;
              }
            }
          }
          else if (*(int *)(in_RDI + 0x2c) == 3) {
            iVar1 = sptk::int24_t::operator_cast_to_int(&local_9f);
            iVar2 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x37));
            if ((longdouble)iVar2 <= (longdouble)iVar1) {
              iVar1 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x3a));
              iVar2 = sptk::int24_t::operator_cast_to_int(&local_9f);
              in_ST6 = in_ST5;
              in_ST7 = in_ST5;
              if ((longdouble)iVar1 < (longdouble)iVar2) {
                sptk::int24_t::operator=(local_e4,(int24_t *)(in_RDI + 0x3a));
                local_e5 = 1;
              }
            }
            else {
              in_ST6 = in_ST5;
              in_ST7 = in_ST5;
              sptk::int24_t::operator=(local_e4,(int24_t *)(in_RDI + 0x37));
              local_e5 = 1;
            }
          }
        }
        if (((*(byte *)(in_RDI + 0x34) & 1) != 0) && ((local_e5 & 1) == 0)) {
          in_stack_fffffffffffffccc = sptk::int24_t::operator_cast_to_int(&local_9f);
          if ((double)in_stack_fffffffffffffccc <= 0.0) {
            sptk::int24_t::operator-
                      ((int24_t *)CONCAT62(in_stack_fffffffffffffcaa,in_stack_fffffffffffffca8),
                       (double)CONCAT62(in_stack_fffffffffffffca2,in_stack_fffffffffffffca0));
            sptk::int24_t::operator=(local_e4,&local_eb);
            sptk::int24_t::~int24_t(&local_eb);
          }
          else {
            sptk::int24_t::operator+
                      ((int24_t *)CONCAT62(in_stack_fffffffffffffcaa,in_stack_fffffffffffffca8),
                       (double)CONCAT62(in_stack_fffffffffffffca2,in_stack_fffffffffffffca0));
            sptk::int24_t::operator=(local_e4,&local_e8);
            sptk::int24_t::~int24_t(&local_e8);
          }
        }
        if (((local_e5 & 1) == 0) || (*(int *)(in_RDI + 0x30) == 0)) {
LAB_0013798d:
          if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
            local_290.value[2] = local_e4[0].value[2];
            local_290.value[0] = local_e4[0].value[0];
            local_290.value[1] = local_e4[0].value[1];
            in_stack_fffffffffffffcb5 =
                 sptk::WriteStream<sptk::int24_t>
                           ((int24_t *)CONCAT62(in_stack_fffffffffffffcaa,in_stack_fffffffffffffca8)
                            ,(ostream *)
                             CONCAT62(in_stack_fffffffffffffca2,in_stack_fffffffffffffca0));
            in_stack_fffffffffffffcb4 = in_stack_fffffffffffffcb5 ^ 0xff;
            sptk::int24_t::~int24_t(&local_290);
            if ((in_stack_fffffffffffffcb4 & 1) == 0) goto LAB_00137b40;
            local_1 = 0;
            local_d0 = 1;
          }
          else {
            local_28c.value[2] = local_e4[0].value[2];
            local_28c.value[0] = local_e4[0].value[0];
            local_28c.value[1] = local_e4[0].value[1];
            in_stack_fffffffffffffcb7 =
                 sptk::SnPrintf<sptk::int24_t>
                           ((int24_t *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                            ,(string *)in_stack_fffffffffffffcc0,(size_t)in_stack_fffffffffffffcb8,
                            (char *)CONCAT17(in_stack_fffffffffffffcb7,
                                             CONCAT16(in_stack_fffffffffffffcb6,
                                                      CONCAT15(in_stack_fffffffffffffcb5,
                                                               CONCAT14(in_stack_fffffffffffffcb4,
                                                                        in_stack_fffffffffffffcb0)))
                                            ));
            in_stack_fffffffffffffcb6 = in_stack_fffffffffffffcb7 ^ 0xff;
            sptk::int24_t::~int24_t(&local_28c);
            if ((in_stack_fffffffffffffcb6 & 1) == 0) {
              std::operator<<((ostream *)&std::cout,local_98);
              if ((local_9c + 1) % *(int *)(in_RDI + 0x28) == 0) {
                std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
              }
              else {
                std::operator<<((ostream *)&std::cout,"\t");
              }
LAB_00137b40:
              local_d0 = 0;
            }
            else {
              local_1 = 0;
              local_d0 = 1;
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_268);
          in_stack_fffffffffffffcc0 = (ostream *)std::ostream::operator<<(local_268,local_9c);
          std::operator<<(in_stack_fffffffffffffcc0,"th data is over the range of output type");
          in_stack_fffffffffffffcb8 = &local_289;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_288,"x2x",in_stack_fffffffffffffcb8);
          sptk::PrintErrorMessage(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          std::__cxx11::string::~string(local_288);
          std::allocator<char>::~allocator((allocator<char> *)&local_289);
          bVar6 = *(int *)(in_RDI + 0x30) == 2;
          if (bVar6) {
            local_1 = 0;
          }
          local_d0 = (uint)bVar6;
          std::__cxx11::ostringstream::~ostringstream(local_268);
          if (local_d0 == 0) goto LAB_0013798d;
        }
        sptk::int24_t::~int24_t(local_e4);
      }
    }
    sptk::int24_t::~int24_t(&local_9f);
    if (local_d0 != 0) {
      if (local_d0 != 1) {
        if (((*(byte *)(in_RDI + 0x36) & 1) != 0) && (local_9c % *(int *)(in_RDI + 0x28) != 0)) {
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        local_1 = 1;
      }
      return (bool)(local_1 & 1);
    }
    local_9c = local_9c + 1;
    in_stack_fffffffffffffcb0 = 0;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }